

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UText * __thiscall icu_63::RegexMatcher::getInput(RegexMatcher *this,UText *dest,UErrorCode *status)

{
  UErrorCode *pUVar1;
  UBool UVar2;
  int64_t iVar3;
  UChar *dest_00;
  UChar *inputChars;
  UErrorCode lengthStatus;
  int32_t input16Len;
  UErrorCode *status_local;
  UText *dest_local;
  RegexMatcher *this_local;
  
  _lengthStatus = status;
  status_local = (UErrorCode *)dest;
  dest_local = (UText *)this;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    UVar2 = ::U_FAILURE(this->fDeferredStatus);
    pUVar1 = status_local;
    if (UVar2 == '\0') {
      if (status_local == (UErrorCode *)0x0) {
        this_local = (RegexMatcher *)
                     utext_clone_63((UText *)0x0,this->fInputText,'\0','\x01',_lengthStatus);
      }
      else {
        if (((this->fInputText->chunkNativeStart == 0) &&
            (this->fInputLength == this->fInputText->chunkNativeLimit)) &&
           (this->fInputLength == (long)this->fInputText->nativeIndexingLimit)) {
          iVar3 = utext_nativeLength_63((UText *)status_local);
          utext_replace_63((UText *)pUVar1,0,iVar3,this->fInputText->chunkContents,
                           (int32_t)this->fInputLength,_lengthStatus);
        }
        else {
          if (this->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0)
          {
            inputChars._4_4_ = (int)this->fInputLength;
          }
          else {
            inputChars._0_4_ = 0;
            inputChars._4_4_ =
                 utext_extract_63(this->fInputText,0,this->fInputLength,(UChar *)0x0,0,
                                  (UErrorCode *)&inputChars);
          }
          dest_00 = (UChar *)uprv_malloc_63((long)inputChars._4_4_ << 1);
          if (dest_00 == (UChar *)0x0) {
            return (UText *)status_local;
          }
          *_lengthStatus = U_ZERO_ERROR;
          utext_extract_63(this->fInputText,0,this->fInputLength,dest_00,inputChars._4_4_,
                           _lengthStatus);
          pUVar1 = status_local;
          *_lengthStatus = U_ZERO_ERROR;
          iVar3 = utext_nativeLength_63((UText *)status_local);
          utext_replace_63((UText *)pUVar1,0,iVar3,dest_00,inputChars._4_4_,_lengthStatus);
          uprv_free_63(dest_00);
        }
        this_local = (RegexMatcher *)status_local;
      }
    }
    else {
      *_lengthStatus = this->fDeferredStatus;
      this_local = (RegexMatcher *)status_local;
    }
  }
  else {
    this_local = (RegexMatcher *)status_local;
  }
  return (UText *)this_local;
}

Assistant:

UText *RegexMatcher::getInput (UText *dest, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (dest) {
        if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
            utext_replace(dest, 0, utext_nativeLength(dest), fInputText->chunkContents, (int32_t)fInputLength, &status);
        } else {
            int32_t input16Len;
            if (UTEXT_USES_U16(fInputText)) {
                input16Len = (int32_t)fInputLength;
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                input16Len = utext_extract(fInputText, 0, fInputLength, NULL, 0, &lengthStatus); // buffer overflow error
            }
            UChar *inputChars = (UChar *)uprv_malloc(sizeof(UChar)*(input16Len));
            if (inputChars == NULL) {
                return dest;
            }

            status = U_ZERO_ERROR;
            utext_extract(fInputText, 0, fInputLength, inputChars, input16Len, &status); // not terminated warning
            status = U_ZERO_ERROR;
            utext_replace(dest, 0, utext_nativeLength(dest), inputChars, input16Len, &status);

            uprv_free(inputChars);
        }
        return dest;
    } else {
        return utext_clone(NULL, fInputText, FALSE, TRUE, &status);
    }
}